

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O0

void COST_SENSITIVE::print_update
               (vw *all,bool is_test,example *ec,multi_ex *ec_seq,bool action_scores,
               uint32_t prediction)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  reference ppeVar3;
  size_t sVar4;
  wclass *pwVar5;
  reference ppeVar6;
  ostream *this;
  undefined8 uVar7;
  substring *ss;
  action_score *paVar8;
  vector<example_*,_std::allocator<example_*>_> *in_RCX;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  byte in_R8B;
  double dVar9;
  substring sVar10;
  ostringstream pred_buf;
  string label_buf;
  v_array<COST_SENSITIVE::wclass> costs;
  example *first_ex;
  example **ecc;
  size_t num_current_features;
  undefined4 in_stack_fffffffffffffd28;
  uint32_t in_stack_fffffffffffffd2c;
  namedlabels *in_stack_fffffffffffffd30;
  substring *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  string local_258 [32];
  substring local_238;
  char *local_228;
  char *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 uVar11;
  string *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  size_t in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe0f;
  shared_data *in_stack_fffffffffffffe10;
  float in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  size_t in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff4f;
  shared_data *in_stack_ffffffffffffff50;
  string local_88 [32];
  __normal_iterator<example_*const_*,_std::vector<example_*,_std::allocator<example_*>_>_> local_68;
  v_array<COST_SENSITIVE::wclass> local_60;
  value_type local_40;
  reference local_38;
  long local_30;
  byte local_21;
  vector<example_*,_std::allocator<example_*>_> *local_20;
  long local_18;
  byte local_9;
  long *local_8;
  
  local_9 = in_SIL & 1;
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  dVar9 = shared_data::weighted_examples((shared_data *)*in_RDI);
  if ((((double)*(float *)(*local_8 + 0x50) <= dVar9) &&
      ((*(byte *)((long)local_8 + 0x3439) & 1) == 0)) &&
     ((*(byte *)((long)local_8 + 0x9c) & 1) == 0)) {
    local_30 = *(long *)(local_18 + 0x68a0);
    if (local_20 != (vector<example_*,_std::allocator<example_*>_> *)0x0) {
      local_30 = 0;
      local_38 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,0);
      ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,0);
      local_40 = *ppeVar3;
      local_60._begin = *(wclass **)&(local_40->l).multi;
      local_60._end = (local_40->l).cs.costs._end;
      local_60.end_array = (local_40->l).cs.costs.end_array;
      local_60.erase_count = (local_40->l).cs.costs.erase_count;
      sVar4 = v_array<COST_SENSITIVE::wclass>::size(&local_60);
      if (((sVar4 == 1) &&
          (pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](&local_60,0),
          pwVar5->class_index == 0)) &&
         (pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](&local_60,0),
         pwVar5->x <= 0.0 && pwVar5->x != 0.0)) {
        local_38 = local_38 + 1;
      }
      while( true ) {
        ppeVar3 = local_38;
        local_68._M_current =
             (example **)
             std::vector<example_*,_std::allocator<example_*>_>::cend
                       ((vector<example_*,_std::allocator<example_*>_> *)
                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        ppeVar6 = __gnu_cxx::
                  __normal_iterator<example_*const_*,_std::vector<example_*,_std::allocator<example_*>_>_>
                  ::operator*(&local_68);
        if (ppeVar3 == ppeVar6) break;
        local_30 = (*local_38)->num_features + local_30;
        local_38 = local_38 + 1;
      }
    }
    std::__cxx11::string::string(local_88);
    if ((local_9 & 1) == 0) {
      std::__cxx11::string::operator=(local_88," known");
    }
    else {
      std::__cxx11::string::operator=(local_88," unknown");
    }
    if (((local_21 & 1) == 0) && (*(long *)(*local_8 + 0x70) == 0)) {
      shared_data::print_update
                (in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f,in_stack_ffffffffffffff40
                 ,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
                 (bool)in_stack_ffffffffffffff27,in_stack_ffffffffffffff20);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffdf0);
      _Var2 = std::setw(8);
      this = std::operator<<((ostream *)&stack0xfffffffffffffdf0,_Var2);
      uVar7 = std::ostream::operator<<(this,std::right);
      _Var1 = std::setfill<char>(' ');
      uVar11 = CONCAT13(_Var1._M_c,(int3)in_stack_fffffffffffffde8);
      std::operator<<(uVar7,_Var1._M_c);
      if (*(long *)(*local_8 + 0x70) == 0) {
        paVar8 = v_array<ACTION_SCORE::action_score>::operator[]
                           ((v_array<ACTION_SCORE::action_score> *)(local_18 + 0x6850),0);
        std::ostream::operator<<(&stack0xfffffffffffffdf0,paVar8->action);
      }
      else if ((local_21 & 1) == 0) {
        local_238 = namedlabels::get(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
        ::operator<<((ostream *)CONCAT17(_Var1._M_c,in_stack_fffffffffffffd80),
                     in_stack_fffffffffffffd78);
      }
      else {
        ss = (substring *)
             v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)(local_18 + 0x6850),0);
        sVar10 = namedlabels::get(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
        in_stack_fffffffffffffde0 = sVar10.end;
        local_228 = sVar10.begin;
        ::operator<<((ostream *)CONCAT17(_Var1._M_c,in_stack_fffffffffffffd80),ss);
      }
      if ((local_21 & 1) != 0) {
        std::operator<<((ostream *)&stack0xfffffffffffffdf0,".....");
      }
      std::__cxx11::ostringstream::str();
      shared_data::print_update
                (in_stack_fffffffffffffe10,(bool)in_stack_fffffffffffffe0f,in_stack_fffffffffffffe00
                 ,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,CONCAT44(_Var2._M_n,uVar11),
                 SUB81((ulong)in_stack_fffffffffffffde0 >> 0x38,0),
                 SUB84(in_stack_fffffffffffffde0,0));
      std::__cxx11::string::~string(local_258);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffdf0);
    }
    std::__cxx11::string::~string(local_88);
  }
  return;
}

Assistant:

void print_update(vw& all, bool is_test, example& ec, multi_ex* ec_seq, bool action_scores, uint32_t prediction)
{
  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet && !all.bfgs)
  {
    size_t num_current_features = ec.num_features;
    // for csoaa_ldf we want features from the whole (multiline example),
    // not only from one line (the first one) represented by ec
    if (ec_seq != nullptr)
    {
      num_current_features = 0;
      // If the first example is "shared", don't include its features.
      // These should be already included in each example (TODO: including quadratic and cubic).
      // TODO: code duplication csoaa.cc LabelDict::ec_is_example_header
      example** ecc = &((*ec_seq)[0]);
      const example& first_ex = *(*ec_seq)[0];

      v_array<COST_SENSITIVE::wclass> costs = first_ex.l.cs.costs;
      if (costs.size() == 1 && costs[0].class_index == 0 && costs[0].x < 0)
        ecc++;

      for (; ecc != &(*ec_seq->cend()); ecc++) num_current_features += (*ecc)->num_features;
    }

    std::string label_buf;
    if (is_test)
      label_buf = " unknown";
    else
      label_buf = " known";

    if (action_scores || all.sd->ldict)
    {
      std::ostringstream pred_buf;

      pred_buf << std::setw(all.sd->col_current_predict) << std::right << std::setfill(' ');
      if (all.sd->ldict)
      {
        if (action_scores)
          pred_buf << all.sd->ldict->get(ec.pred.a_s[0].action);
        else
          pred_buf << all.sd->ldict->get(prediction);
      }
      else
        pred_buf << ec.pred.a_s[0].action;
      if (action_scores)
        pred_buf << ".....";
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, pred_buf.str(), num_current_features,
          all.progress_add, all.progress_arg);
      ;
    }
    else
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, prediction, num_current_features,
          all.progress_add, all.progress_arg);
  }
}